

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

fio_meta_ary_s * fio_postoffice_meta_copy_new(void)

{
  size_t sVar1;
  fio_meta_ary_s *in_RDI;
  
  memset(in_RDI,0,0x20);
  sVar1 = fio_meta_ary_count(&fio_postoffice.meta.ary);
  if (sVar1 != 0) {
    fio_lock(&fio_postoffice.meta.lock);
    fio_meta_ary_concat(in_RDI,&fio_postoffice.meta.ary);
    fio_unlock(&fio_postoffice.meta.lock);
  }
  return in_RDI;
}

Assistant:

static fio_meta_ary_s fio_postoffice_meta_copy_new(void) {
  fio_meta_ary_s t = FIO_ARY_INIT;
  if (!fio_meta_ary_count(&fio_postoffice.meta.ary)) {
    return t;
  }
  fio_lock(&fio_postoffice.meta.lock);
  fio_meta_ary_concat(&t, &fio_postoffice.meta.ary);
  fio_unlock(&fio_postoffice.meta.lock);
  return t;
}